

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O1

shared_ptr<MyCompiler::Block> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Block>(RecursiveDescentParser *this)

{
  int iVar1;
  istream *piVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  value_type *pvVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  long in_RSI;
  shared_ptr<MyCompiler::Statement> sVar7;
  shared_ptr<MyCompiler::Block> sVar8;
  value_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  this->stream = (istream *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MyCompiler::Block,std::allocator<MyCompiler::Block>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->currentToken,(Block **)this,
             (allocator<MyCompiler::Block> *)&local_38);
  if (*(int *)(in_RSI + 0x30) == 0x1c) {
    parse<MyCompiler::ConstDeclaration>((RecursiveDescentParser *)&local_38);
    p_Var5 = p_Stack_30;
    pvVar4 = local_38;
    piVar2 = this->stream;
    local_38 = (value_type *)0x0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar2 + 0x50);
    *(value_type **)(piVar2 + 0x48) = pvVar4;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar2 + 0x50) = p_Var5;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    }
  }
  if (*(int *)(in_RSI + 0x30) == 0x1d) {
    parse<MyCompiler::VarDeclaration>((RecursiveDescentParser *)&local_38);
    p_Var5 = p_Stack_30;
    pvVar4 = local_38;
    piVar2 = this->stream;
    local_38 = (value_type *)0x0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar2 + 0x60);
    *(value_type **)(piVar2 + 0x58) = pvVar4;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar2 + 0x60) = p_Var5;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    }
  }
  iVar1 = *(int *)(in_RSI + 0x30);
  while (iVar1 == 0x1e) {
    piVar2 = this->stream;
    parse<MyCompiler::ProcedureDeclaration>((RecursiveDescentParser *)&local_38);
    std::vector<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_>
    ::push_back((vector<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_>
                 *)(piVar2 + 0x68),local_38);
    if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    }
    iVar1 = *(int *)(in_RSI + 0x30);
  }
  sVar7 = parse<MyCompiler::Statement>((RecursiveDescentParser *)&local_38);
  p_Var5 = p_Stack_30;
  pvVar4 = local_38;
  _Var6 = sVar7.super___shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  piVar2 = this->stream;
  local_38 = (value_type *)0x0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar2 + 0x88);
  *(value_type **)(piVar2 + 0x80) = pvVar4;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar2 + 0x88) = p_Var5;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    _Var6._M_pi = extraout_RDX;
  }
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    _Var6._M_pi = extraout_RDX_00;
  }
  sVar8.super___shared_ptr<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar8.super___shared_ptr<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Block>)
         sVar8.super___shared_ptr<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Block> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Block>();

    if (sym == SymbolType::CONST)
        pResult->pConstDeclaration = parse<ConstDeclaration>();
    if (sym == SymbolType::VAR)
        pResult->pVarDeclaration = parse<VarDeclaration>();
    while (sym == SymbolType::PROC)
        pResult->vProcedureDeclaration.push_back(*parse<ProcedureDeclaration>());
    pResult->pStatement = parse<Statement>();

    return pResult;
}